

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol.cpp
# Opt level: O0

void EBMOL::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Geometry *geom,Real dt,bool is_velocity,string *redistribution_type)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FabType FVar4;
  FabFactory<amrex::FArrayBox> *pFVar5;
  MFItInfo *pMVar6;
  FabArrayBase *in_RCX;
  int in_EDX;
  int in_ESI;
  FabArrayBase *in_RDI;
  int in_R8D;
  FabArrayBase *in_stack_00000030;
  FabArrayBase *in_stack_00000038;
  FabArrayBase *in_stack_00000040;
  int in_stack_00000048;
  byte in_stack_00000050;
  FabArrayBase *in_stack_00000058;
  FabArrayBase *in_stack_00000060;
  FabArrayBase *in_stack_00000068;
  int in_stack_00000070;
  anon_class_128_2_3c46345a *in_stack_00000080;
  MultiCutFab *in_stack_00000088;
  byte in_stack_00000090;
  string *in_stack_00000098;
  Array4<double> advc_arr_1;
  Array4<double> *aofs_arr_2;
  Array4<double> *aofs_arr_1;
  Array4<double> divtmp_redist_arr;
  Array4<double> scratch;
  Elixir eli;
  FArrayBox tmpfab;
  Box gbx;
  Array4<const_double> vfrac_1;
  Array4<const_double> ccc_1;
  Array4<const_double> fcz_1;
  Array4<const_double> fcy_1;
  Array4<const_double> fcx_1;
  Array4<const_double> apz_1;
  Array4<const_double> apy_1;
  Array4<const_double> apx_1;
  Box result_1;
  Array4<const_amrex::EBCellFlag> *flag_1;
  EBCellFlagFab *flagfab_1;
  Box *bx_1;
  MFIter mfi_1;
  MultiFab *sstate;
  MultiFab sstate_tmp;
  Real mult_1;
  Array4<const_double> w_1;
  Array4<const_double> v_1;
  Array4<const_double> u_1;
  Array4<const_double> q_1;
  Real mult;
  Array4<const_double> w;
  Array4<const_double> v;
  Array4<const_double> u;
  Array4<const_double> q;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> vfrac;
  Array4<const_double> ccc;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  Box result;
  bool regular;
  Array4<double> advc_arr;
  Array4<const_double> wc;
  Array4<const_double> vc;
  Array4<const_double> uc;
  Array4<double> *aofs_arr;
  Array4<const_amrex::EBCellFlag> *flag;
  EBCellFlagFab *flagfab;
  Array4<double> zed;
  Array4<double> yed;
  Array4<double> xed;
  Array4<double> fz;
  Array4<double> fy;
  Array4<double> fx;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  Box *domain;
  MultiFab advc;
  int halo;
  EBFArrayBoxFactory *ebfactory;
  bool fluxes_are_area_weighted;
  undefined8 f2;
  MultiCutFab *in_stack_ffffffffffffdd20;
  Array4<const_double> *pAVar7;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffdd28;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffdd30;
  MultiCutFab *in_stack_ffffffffffffdd38;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffdd40;
  anon_class_128_2_3c46345a *paVar8;
  FabArrayBase *in_stack_ffffffffffffdd48;
  MultiCutFab *in_stack_ffffffffffffdd50;
  BoxArray *in_stack_ffffffffffffdd58;
  undefined4 uVar9;
  anon_class_128_2_3c46345a *in_stack_ffffffffffffdd60;
  MultiCutFab *in_stack_ffffffffffffdd68;
  undefined4 uVar10;
  anon_class_128_2_3c46345a *in_stack_ffffffffffffdd70;
  MFIter *in_stack_ffffffffffffdd80;
  undefined8 in_stack_ffffffffffffdd88;
  undefined4 in_stack_ffffffffffffdd90;
  undefined4 in_stack_ffffffffffffdd94;
  Box *in_stack_ffffffffffffde40;
  EBCellFlagFab *in_stack_ffffffffffffde48;
  undefined8 in_stack_ffffffffffffde78;
  Real in_stack_ffffffffffffde80;
  undefined8 in_stack_ffffffffffffde88;
  Array4<const_double> *in_stack_ffffffffffffde90;
  undefined4 in_stack_ffffffffffffde98;
  undefined4 in_stack_ffffffffffffde9c;
  undefined4 in_stack_ffffffffffffdea0;
  undefined4 in_stack_ffffffffffffdea4;
  Array4<double> *in_stack_ffffffffffffdea8;
  Box *in_stack_ffffffffffffdeb0;
  undefined4 in_stack_ffffffffffffdebc;
  Real in_stack_ffffffffffffdec0;
  undefined7 in_stack_ffffffffffffdec8;
  undefined1 in_stack_ffffffffffffdecf;
  Geometry *in_stack_ffffffffffffded0;
  Array4<const_double> *in_stack_ffffffffffffded8;
  Array4<const_double> *in_stack_ffffffffffffdee0;
  Array4<const_double> *in_stack_ffffffffffffdee8;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffdef0;
  Geometry *in_stack_ffffffffffffdf20;
  undefined1 *in_stack_ffffffffffffdf30;
  char *in_stack_ffffffffffffdf38;
  Geometry *geom_00;
  undefined8 in_stack_ffffffffffffdf40;
  int iVar11;
  char *in_stack_ffffffffffffdf48;
  char *in_stack_ffffffffffffdf50;
  undefined1 local_1f88 [23];
  undefined1 in_stack_ffffffffffffe08f;
  Array4<const_double> *in_stack_ffffffffffffe090;
  Array4<const_double> *in_stack_ffffffffffffe098;
  Array4<double> *in_stack_ffffffffffffe0a0;
  Array4<double> *in_stack_ffffffffffffe0a8;
  Array4<double> *in_stack_ffffffffffffe0b0;
  Box *in_stack_ffffffffffffe0b8;
  undefined1 local_1f08 [64];
  undefined1 local_1ec8 [64];
  undefined1 *local_1e88;
  undefined1 local_1e80 [64];
  undefined1 auStack_1e40 [64];
  undefined1 local_1e00 [15];
  undefined1 in_stack_ffffffffffffe20f;
  Array4<const_double> *in_stack_ffffffffffffe210;
  Array4<const_double> *in_stack_ffffffffffffe218;
  Array4<double> *in_stack_ffffffffffffe220;
  Array4<double> *in_stack_ffffffffffffe228;
  Array4<double> *in_stack_ffffffffffffe230;
  Box *in_stack_ffffffffffffe238;
  undefined1 local_1db8 [120];
  Array4<const_double> *in_stack_ffffffffffffe2c0;
  Array4<const_double> *in_stack_ffffffffffffe2c8;
  Array4<const_double> *in_stack_ffffffffffffe2d0;
  Array4<const_double> *in_stack_ffffffffffffe2d8;
  Geometry *in_stack_ffffffffffffe2e0;
  int in_stack_ffffffffffffe2e8;
  undefined1 local_1cd8 [43];
  undefined1 in_stack_ffffffffffffe353;
  int in_stack_ffffffffffffe354;
  Array4<const_double> *in_stack_ffffffffffffe358;
  Array4<double> *in_stack_ffffffffffffe360;
  Array4<double> *in_stack_ffffffffffffe368;
  Array4<double> *in_stack_ffffffffffffe370;
  Box *in_stack_ffffffffffffe378;
  Array4<double> local_1c38;
  undefined1 local_1be0 [16];
  double *local_1bd0;
  undefined1 auStack_1bc8 [8];
  Array4<const_double> *in_stack_ffffffffffffe440;
  Array4<const_double> *in_stack_ffffffffffffe448;
  Array4<const_double> *in_stack_ffffffffffffe450;
  Array4<const_double> *in_stack_ffffffffffffe458;
  Array4<const_double> *in_stack_ffffffffffffe460;
  Array4<const_double> *in_stack_ffffffffffffe468;
  int in_stack_ffffffffffffe470;
  int in_stack_ffffffffffffe474;
  int in_stack_ffffffffffffe478;
  int in_stack_ffffffffffffe47c;
  IndexType in_stack_ffffffffffffe480;
  Array4<const_amrex::EBCellFlag> *in_stack_ffffffffffffe488;
  Array4<const_double> *in_stack_ffffffffffffe4c0;
  Array4<const_double> *in_stack_ffffffffffffe4c8;
  Array4<const_double> *in_stack_ffffffffffffe4d0;
  Box *in_stack_ffffffffffffe4d8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_ffffffffffffe4e0;
  BCRec *in_stack_ffffffffffffe4e8;
  undefined1 local_1af0 [288];
  undefined1 local_19d0 [244];
  pointer local_18dc;
  pointer local_18d4;
  pointer local_18cc;
  IndexType local_18c4;
  Array4<const_amrex::EBCellFlag> local_18c0;
  undefined8 local_1880;
  undefined8 local_1878;
  undefined1 local_186c [132];
  RefID local_17e8;
  int aiStack_17e0 [4];
  __uniq_ptr_impl<amrex::FabFactory<amrex::CutFab>,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
  _Stack_17d0;
  DataAllocator local_17c8;
  FabArrayBase *target_volfrac;
  pointer in_stack_ffffffffffffe850;
  Array4<double> *in_stack_ffffffffffffe858;
  undefined8 in_stack_ffffffffffffe860;
  undefined8 in_stack_ffffffffffffe868;
  undefined8 in_stack_ffffffffffffe870;
  undefined4 in_stack_ffffffffffffe87c;
  undefined8 in_stack_ffffffffffffe880;
  Array4<const_double> local_1610;
  Array4<const_double> local_15d0;
  Array4<const_double> local_1590;
  undefined8 local_1550;
  undefined1 local_1548 [128];
  Array4<const_double> local_14c8 [2];
  undefined1 local_1448 [299];
  undefined1 in_stack_ffffffffffffece3;
  int in_stack_ffffffffffffece4;
  Array4<const_double> *in_stack_ffffffffffffece8;
  Array4<double> *in_stack_ffffffffffffecf0;
  Array4<double> *in_stack_ffffffffffffecf8;
  Array4<double> *in_stack_ffffffffffffed00;
  Box *in_stack_ffffffffffffed08;
  Array4<const_double> local_1280;
  Array4<const_double> local_1240 [2];
  Array4<const_double> *in_stack_ffffffffffffee50;
  Array4<const_double> *in_stack_ffffffffffffee58;
  Array4<const_double> *in_stack_ffffffffffffee60;
  MultiArray4<double> in_stack_ffffffffffffee68;
  MultiArray4<const_double> in_stack_ffffffffffffee70;
  pointer in_stack_ffffffffffffee78;
  Array4<const_double> *in_stack_ffffffffffffee80;
  Array4<const_double> *in_stack_ffffffffffffee88;
  Array4<const_double> *in_stack_ffffffffffffee90;
  Array4<const_double> *in_stack_ffffffffffffee98;
  Array4<const_double> *in_stack_ffffffffffffeea0;
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> in_stack_ffffffffffffeea8;
  undefined1 local_10e8 [176];
  MultiCutFab local_1038;
  double *local_e70;
  Real local_e68;
  Real local_e60;
  IndexType local_e58;
  undefined1 local_e51;
  undefined1 local_e10 [192];
  Array4<const_amrex::EBCellFlag> *in_stack_fffffffffffff2b0;
  Array4<const_double> *in_stack_fffffffffffff2b8;
  Array4<const_double> *in_stack_fffffffffffff2c0;
  Array4<const_double> *in_stack_fffffffffffff2c8;
  Array4<const_double> *in_stack_fffffffffffff2d0;
  Array4<const_double> *in_stack_fffffffffffff2d8;
  Array4<const_double> *in_stack_fffffffffffff2e0;
  Array4<const_double> *in_stack_fffffffffffff2e8;
  Array4<const_double> *in_stack_fffffffffffff2f0;
  BCRec *in_stack_fffffffffffff2f8;
  Geometry *in_stack_fffffffffffff300;
  string *in_stack_fffffffffffff308;
  int in_stack_fffffffffffff310;
  Array4<const_double> *in_stack_fffffffffffff318;
  FabArray<amrex::FArrayBox> local_cd0;
  pointer *local_b50;
  undefined1 local_b48 [144];
  Array4<double> local_ab8;
  Array4<double> local_a78;
  Array4<double> local_a38;
  Array4<double> local_9f8;
  Array4<double> local_9b8;
  undefined1 local_974 [28];
  undefined1 *local_958;
  undefined1 local_94c [108];
  Geometry *local_8e0;
  MFIter local_8d8;
  MFItInfo local_874;
  Box *local_860;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  int local_694;
  MultiCutFab *local_690;
  byte local_682;
  byte local_681;
  byte local_671;
  int local_664;
  FabArrayBase *local_660;
  int local_658;
  int local_654;
  FabArrayBase *local_650;
  undefined8 local_648;
  undefined4 local_63c;
  char *local_638;
  char *local_630;
  undefined8 local_628;
  undefined4 local_61c;
  char *local_618;
  char *local_610;
  undefined8 local_608;
  undefined4 local_5fc;
  char *local_5f8;
  char *local_5f0;
  undefined8 local_5e8;
  undefined4 local_5dc;
  char *local_5d8;
  char *local_5d0;
  undefined8 local_5c8;
  undefined4 local_5bc;
  char *local_5b8;
  char *local_5b0;
  undefined8 local_5a8;
  undefined4 local_59c;
  char *local_598;
  char *local_590;
  undefined8 local_588;
  undefined4 local_57c;
  char *local_578;
  char *local_570;
  undefined8 local_568;
  undefined4 local_55c;
  char *local_558;
  char *local_550;
  undefined8 local_548;
  undefined4 local_53c;
  char *local_538;
  char *local_530;
  undefined8 local_528;
  undefined4 local_51c;
  char *local_518;
  char *local_510;
  undefined8 local_508;
  undefined4 local_4fc;
  char *local_4f8;
  char *local_4f0;
  undefined8 local_4e8;
  undefined4 local_4dc;
  char *local_4d8;
  char *local_4d0;
  undefined8 local_4c8;
  undefined4 local_4bc;
  char *local_4b8;
  char *local_4b0;
  EBCellFlagFab *local_4a8;
  EBCellFlagFab *local_4a0;
  undefined4 local_494;
  element_type *local_490;
  int local_484;
  Geometry *local_480;
  Array4<double> local_478;
  int local_434;
  undefined1 *local_430;
  Array4<double> local_428;
  int local_3e4;
  undefined1 *local_3e0;
  Dim3 local_3d8;
  Dim3 local_3c4;
  Dim3 local_3b8;
  Dim3 local_3a8;
  int local_39c;
  Box *local_398;
  EBCellFlag *local_390;
  Dim3 local_388;
  Dim3 local_374;
  Dim3 local_368;
  Dim3 local_358;
  int local_34c;
  Box *local_348;
  EBCellFlag *local_340;
  Dim3 local_338;
  Box *local_328;
  int local_320;
  int iStack_31c;
  int local_318;
  undefined4 local_314;
  Box *local_310;
  undefined4 local_304;
  Box *local_300;
  undefined4 local_2f4;
  Box *local_2f0;
  Dim3 local_2e8;
  Box *local_2d8;
  int local_2d0;
  int iStack_2cc;
  int local_2c8;
  undefined4 local_2c4;
  Box *local_2c0;
  undefined4 local_2b4;
  Box *local_2b0;
  undefined4 local_2a4;
  Box *local_2a0;
  Dim3 local_298;
  Box *local_288;
  int local_280;
  int iStack_27c;
  int local_278;
  undefined4 local_274;
  IntVect *local_270;
  undefined4 local_264;
  IntVect *local_260;
  undefined4 local_254;
  IntVect *local_250;
  Dim3 local_248;
  Box *local_238;
  int local_230;
  int iStack_22c;
  int local_228;
  undefined4 local_224;
  IntVect *local_220;
  undefined4 local_214;
  IntVect *local_210;
  undefined4 local_204;
  IntVect *local_200;
  Dim3 local_1f8;
  Dim3 local_1e8 [2];
  int local_1d0;
  Dim3 local_1c8;
  int local_1bc;
  undefined1 *local_1b8;
  int local_1a0;
  undefined1 *local_198;
  int local_188;
  undefined4 local_184;
  undefined1 *local_180;
  undefined4 local_174;
  undefined1 *local_170;
  undefined4 local_164;
  undefined1 *local_160;
  Dim3 local_158;
  undefined1 *local_148;
  int local_140;
  int iStack_13c;
  int local_138;
  undefined4 local_134;
  undefined1 *local_130;
  undefined4 local_124;
  undefined1 *local_120;
  undefined4 local_114;
  undefined1 *local_110;
  Dim3 local_108;
  Dim3 local_f8 [2];
  int local_e0;
  Dim3 local_d8;
  int local_cc;
  undefined1 *local_c8;
  int local_b0;
  undefined1 *local_a8;
  int local_98;
  undefined4 local_94;
  undefined1 *local_90;
  undefined4 local_84;
  undefined1 *local_80;
  undefined4 local_74;
  undefined1 *local_70;
  Dim3 local_68;
  undefined1 *local_58;
  int local_50;
  int iStack_4c;
  int local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined4 local_34;
  undefined1 *local_30;
  undefined4 local_24;
  undefined1 *local_20;
  
  iVar11 = (int)((ulong)in_stack_ffffffffffffdf40 >> 0x20);
  local_671 = in_stack_00000050 & 1;
  local_681 = in_stack_00000090 & 1;
  local_682 = 1;
  local_664 = in_R8D;
  local_660 = in_RCX;
  local_658 = in_EDX;
  local_654 = in_ESI;
  local_650 = in_RDI;
  iVar2 = amrex::FabArrayBase::nComp(in_RCX);
  if (iVar2 < local_664 + local_658) {
    local_4b0 = "state.nComp() >= state_comp + ncomp";
    local_4b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_4bc = 0x152;
    local_4c8 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nComp(local_650);
  if (iVar2 < local_654 + local_658) {
    local_4d0 = "aofs.nComp() >= aofs_comp + ncomp";
    local_4d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_4dc = 0x153;
    local_4e8 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nComp(in_stack_00000030);
  if (iVar2 < in_stack_00000048 + local_658) {
    local_4f0 = "xedge.nComp() >= edge_comp + ncomp";
    local_4f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_4fc = 0x154;
    local_508 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nComp(in_stack_00000038);
  if (iVar2 < in_stack_00000048 + local_658) {
    local_510 = "yedge.nComp() >= edge_comp + ncomp";
    local_518 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_51c = 0x155;
    local_528 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nComp(in_stack_00000040);
  if (iVar2 < in_stack_00000048 + local_658) {
    local_530 = "zedge.nComp() >= edge_comp + ncomp";
    local_538 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_53c = 0x156;
    local_548 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nComp(in_stack_00000058);
  if (iVar2 < in_stack_00000070 + local_658) {
    local_550 = "xfluxes.nComp() >= fluxes_comp + ncomp";
    local_558 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_55c = 0x157;
    local_568 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nComp(in_stack_00000060);
  if (iVar2 < in_stack_00000070 + local_658) {
    local_570 = "yfluxes.nComp() >= fluxes_comp + ncomp";
    local_578 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_57c = 0x158;
    local_588 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nComp(in_stack_00000068);
  if (iVar2 < in_stack_00000070 + local_658) {
    local_590 = "zfluxes.nComp() >= fluxes_comp + ncomp";
    local_598 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_59c = 0x159;
    local_5a8 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nGrow(in_stack_00000058,0);
  iVar3 = amrex::FabArrayBase::nGrow(in_stack_00000030,0);
  if (iVar2 != iVar3) {
    local_5b0 = "xfluxes.nGrow() == xedge.nGrow()";
    local_5b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_5bc = 0x15a;
    local_5c8 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nGrow(in_stack_00000060,0);
  iVar3 = amrex::FabArrayBase::nGrow(in_stack_00000038,0);
  if (iVar2 != iVar3) {
    local_5d0 = "yfluxes.nGrow() == yedge.nGrow()";
    local_5d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_5dc = 0x15b;
    local_5e8 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  iVar2 = amrex::FabArrayBase::nGrow(in_stack_00000068,0);
  iVar3 = amrex::FabArrayBase::nGrow(in_stack_00000040,0);
  if (iVar2 != iVar3) {
    local_5f0 = "zfluxes.nGrow() == zedge.nGrow()";
    local_5f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_5fc = 0x15c;
    local_608 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  if (((local_671 & 1) == 0) && (iVar2 = amrex::FabArrayBase::nGrow(local_660,0), iVar2 < 2)) {
    local_610 = "state.nGrow() >= 2";
    local_618 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_61c = 0x161;
    local_628 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  bVar1 = amrex::FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_ffffffffffffdd30);
  if (!bVar1) {
    local_630 = "state.hasEBFabFactory()";
    local_638 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
    ;
    local_63c = 0x163;
    local_648 = 0;
    amrex::Assert_host(in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,iVar11,
                       in_stack_ffffffffffffdf38);
  }
  pFVar5 = amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0xded4ca);
  local_690 = (MultiCutFab *)
              __dynamic_cast(pFVar5,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_690 != (MultiCutFab *)0x0) {
    local_694 = ((byte)~local_671 & 1) * 2;
    amrex::FabArrayBase::boxArray(local_660);
    amrex::FabArrayBase::DistributionMap(local_660);
    local_838 = 0;
    uStack_830 = 0;
    local_848 = 0;
    uStack_840 = 0;
    local_828 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0xded58b);
    f2 = local_690;
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffdd60,in_stack_ffffffffffffdd58,
               (DistributionMapping *)in_stack_ffffffffffffdd50,
               (int)((ulong)in_stack_ffffffffffffdd48 >> 0x20),(int)in_stack_ffffffffffffdd48,
               (MFInfo *)in_stack_ffffffffffffdd40,
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdd70);
    amrex::MFInfo::~MFInfo((MFInfo *)0xded5da);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd20,(value_type)f2);
    local_860 = amrex::Geometry::Domain((Geometry *)in_stack_00000088);
    amrex::MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffdd30);
    pMVar6 = amrex::MFItInfo::EnableTiling
                       (&local_874,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size);
    amrex::MFItInfo::SetDynamic(pMVar6,true);
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffdd50,in_stack_ffffffffffffdd48,
               (MFItInfo *)in_stack_ffffffffffffdd40);
    while (bVar1 = amrex::MFIter::isValid(&local_8d8), bVar1) {
      amrex::MFIter::tilebox(in_stack_ffffffffffffdd80);
      local_8e0 = (Geometry *)(local_94c + 0x50);
      amrex::MFIter::nodaltilebox
                ((MFIter *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                 (int)((ulong)in_stack_ffffffffffffdd88 >> 0x20));
      local_94c._68_8_ = local_94c + 0x28;
      amrex::MFIter::nodaltilebox
                ((MFIter *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                 (int)((ulong)in_stack_ffffffffffffdd88 >> 0x20));
      local_94c._28_8_ = (MultiCutFab *)local_94c;
      amrex::MFIter::nodaltilebox
                ((MFIter *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                 (int)((ulong)in_stack_ffffffffffffdd88 >> 0x20));
      local_958 = local_974;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                 (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                 (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                 (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                 (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                 (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                 (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
      amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                ((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
      local_b48._72_8_ =
           amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                     ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffdd20,(MFIter *)f2);
      local_390 = (((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_398 = &(((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain;
      local_39c = (((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_2a4 = 0;
      local_2d0 = (local_398->smallend).vect[0];
      local_2b4 = 1;
      iStack_2cc = (((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   smallend.vect[1];
      local_3b8.x = (local_398->smallend).vect[0];
      local_3b8.y = (local_398->smallend).vect[1];
      local_2c4 = 2;
      local_3b8.z = (((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    smallend.vect[2];
      local_200 = &(((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   bigend;
      local_204 = 0;
      local_230 = local_200->vect[0] + 1;
      local_210 = &(((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   bigend;
      local_214 = 1;
      iStack_22c = (((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   bigend.vect[1] + 1;
      local_220 = &(((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                   bigend;
      local_224 = 2;
      local_3d8.z = (((EBCellFlagFab *)local_b48._72_8_)->super_BaseFab<amrex::EBCellFlag>).domain.
                    bigend.vect[2] + 1;
      local_3d8.y = iStack_22c;
      local_3d8.x = local_230;
      local_4a0 = (EBCellFlagFab *)local_b48._72_8_;
      local_3c4._0_8_ = local_3d8._0_8_;
      local_3c4.z = local_3d8.z;
      local_3a8._0_8_ = local_3b8._0_8_;
      local_3a8.z = local_3b8.z;
      local_2e8._0_8_ = local_3b8._0_8_;
      local_2e8.z = local_3b8.z;
      local_2d8 = local_398;
      local_2c8 = local_3b8.z;
      local_2c0 = local_398;
      local_2b0 = local_398;
      local_2a0 = local_398;
      local_248._0_8_ = local_3d8._0_8_;
      local_248.z = local_3d8.z;
      local_238 = local_398;
      local_228 = local_3d8.z;
      amrex::Array4<const_amrex::EBCellFlag>::Array4
                ((Array4<const_amrex::EBCellFlag> *)local_b48,local_390,&local_3a8,&local_3c4,
                 local_39c);
      local_b48._64_8_ = local_b48;
      FVar4 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffde48,in_stack_ffffffffffffde40);
      if (FVar4 == covered) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                   (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
        iVar11 = (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20);
        local_b50 = &local_cd0.m_tags.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        memcpy(&local_cd0.define_function_called,local_b50,0x3c);
        memcpy(&local_cd0.super_FabArrayBase.indexArray,&local_9b8,0x3c);
        memcpy(&local_cd0.super_FabArrayBase.n_grow,&local_a78,0x3c);
        iVar2 = local_658;
        f2 = local_94c._28_8_;
        memcpy(&local_cd0,&local_9f8,0x3c);
        memcpy((void *)((long)&local_cd0.super_FabArrayBase.boxarray.m_bat.m_op + 0x34),&local_ab8,
               0x3c);
        in_stack_ffffffffffffdd28 = &local_cd0;
        in_stack_ffffffffffffdd20 = (MultiCutFab *)CONCAT44(iVar11,iVar2);
        amrex::
        ParallelFor<int,int,int,EBMOL::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__0,EBMOL::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__1,EBMOL::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__2,void,void,void>
                  ((Box *)in_stack_ffffffffffffdd40,(int)((ulong)in_stack_ffffffffffffdd38 >> 0x20),
                   (anon_class_64_1_e8a15f1b *)in_stack_ffffffffffffdd30,
                   (Box *)in_stack_ffffffffffffdd28,iVar11,(anon_class_128_2_7b0e3944 *)f2,
                   (Box *)in_stack_ffffffffffffdd50,(int)in_stack_ffffffffffffdd58,
                   (anon_class_128_2_7b0e3d24 *)in_stack_ffffffffffffdd60);
        memcpy(&stack0xfffffffffffff2b0,&local_a38,0x3c);
        memcpy(&stack0xfffffffffffff2f0,local_b48 + 0x50,0x3c);
        amrex::
        ParallelFor<int,EBMOL::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__3,void>
                  ((Box *)in_stack_ffffffffffffdd70,(int)((ulong)in_stack_ffffffffffffdd68 >> 0x20),
                   (anon_class_128_2_7b0e4104 *)in_stack_ffffffffffffdd60);
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
        uVar10 = (undefined4)((ulong)in_stack_ffffffffffffdd40 >> 0x20);
        uVar9 = (undefined4)((ulong)in_stack_ffffffffffffdd48 >> 0x20);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
        local_480 = local_8e0;
        local_484 = local_694;
        local_e70 = *(double **)&local_8e0->super_CoordSys;
        local_e68 = (local_8e0->super_CoordSys).offset[0];
        local_e60 = (local_8e0->super_CoordSys).offset[1];
        local_e58.itype = *(uint *)((local_8e0->super_CoordSys).offset + 2);
        amrex::Box::grow((Box *)&local_e70,local_694);
        FVar4 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffde48,in_stack_ffffffffffffde40);
        local_e51 = FVar4 == regular;
        if ((bool)local_e51) {
          if ((local_671 & 1) == 0) {
            in_stack_ffffffffffffdf30 = local_1448 + 0x80;
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                       (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
            in_stack_ffffffffffffdf20 = (Geometry *)local_1448;
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
            paVar8 = in_stack_00000080;
            MOL::ComputeEdgeState
                      (in_stack_ffffffffffffe378,in_stack_ffffffffffffe370,in_stack_ffffffffffffe368
                       ,in_stack_ffffffffffffe360,in_stack_ffffffffffffe358,
                       in_stack_ffffffffffffe354,in_stack_ffffffffffffe4c0,in_stack_ffffffffffffe4c8
                       ,in_stack_ffffffffffffe4d0,in_stack_ffffffffffffe4d8,
                       in_stack_ffffffffffffe4e0,in_stack_ffffffffffffe4e8,
                       (bool)in_stack_ffffffffffffe353);
            uVar10 = (undefined4)((ulong)paVar8 >> 0x20);
          }
          pAVar7 = local_14c8;
          amrex::Array4<const_double>::Array4<const_double,_0>(pAVar7,&local_a78);
          in_stack_ffffffffffffdd28 = (FabArray<amrex::FArrayBox> *)(local_1548 + 0x40);
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffdd28,&local_ab8);
          in_stack_ffffffffffffdd30 = (FabArray<amrex::FArrayBox> *)local_1548;
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffdd30,
                     (Array4<double> *)(local_b48 + 0x50));
          in_stack_ffffffffffffdd48 =
               (FabArrayBase *)(CONCAT44(uVar9,(uint)local_682) & 0xffffffff00000001);
          in_stack_ffffffffffffdd40 = (FabArray<amrex::FArrayBox> *)CONCAT44(uVar10,local_658);
          in_stack_ffffffffffffdd38 = in_stack_00000088;
          in_stack_ffffffffffffdef0 = in_stack_ffffffffffffdd30;
          HydroUtils::ComputeFluxes
                    (in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0a8,
                     in_stack_ffffffffffffe0a0,in_stack_ffffffffffffe098,in_stack_ffffffffffffe090,
                     in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2c8,in_stack_ffffffffffffe2d0,
                     in_stack_ffffffffffffe2d8,in_stack_ffffffffffffe2e0,in_stack_ffffffffffffe2e8,
                     (bool)in_stack_ffffffffffffe08f);
          uVar10 = (undefined4)((ulong)pAVar7 >> 0x20);
          local_1550 = 0xbff0000000000000;
          in_stack_ffffffffffffded8 = &local_1590;
          in_stack_ffffffffffffded0 = local_8e0;
          amrex::Array4<const_double>::Array4<const_double,_0>(in_stack_ffffffffffffded8,&local_9b8)
          ;
          in_stack_ffffffffffffdee0 = &local_15d0;
          amrex::Array4<const_double>::Array4<const_double,_0>(in_stack_ffffffffffffdee0,&local_9f8)
          ;
          in_stack_ffffffffffffdee8 = &local_1610;
          amrex::Array4<const_double>::Array4<const_double,_0>(in_stack_ffffffffffffdee8,&local_a38)
          ;
          in_stack_ffffffffffffdd20 =
               (MultiCutFab *)(CONCAT44(uVar10,(uint)local_682) & 0xffffffff00000001);
          f2 = in_stack_00000088;
          HydroUtils::ComputeDivergence
                    (in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8,
                     (Array4<const_double> *)
                     CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
                     (Array4<const_double> *)
                     CONCAT44(in_stack_ffffffffffffde9c,in_stack_ffffffffffffde98),
                     in_stack_ffffffffffffde90,(int)((ulong)in_stack_ffffffffffffde88 >> 0x20),
                     in_stack_ffffffffffffdf20,in_stack_ffffffffffffde80,
                     SUB81((ulong)in_stack_ffffffffffffde78 >> 0x38,0));
        }
        else {
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          uVar9 = (undefined4)((ulong)in_stack_ffffffffffffdd58 >> 0x20);
          uVar10 = (undefined4)((ulong)in_stack_ffffffffffffdd68 >> 0x20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          if ((local_671 & 1) == 0) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                       (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
            uVar10 = (undefined4)((ulong)((long)&local_1038 + 0x40U) >> 0x20);
            uVar9 = (undefined4)((ulong)((long)&local_1038 + 0xd8U) >> 0x20);
            in_stack_ffffffffffffdd70 = (anon_class_128_2_3c46345a *)local_b48._64_8_;
            ComputeEdgeState(in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,
                             in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0,
                             in_stack_ffffffffffffece8,in_stack_ffffffffffffece4,
                             in_stack_ffffffffffffee50,in_stack_ffffffffffffee58,
                             in_stack_ffffffffffffee60,(Box *)in_stack_ffffffffffffee68.hp,
                             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                             in_stack_ffffffffffffee70.hp,(BCRec *)in_stack_ffffffffffffee78,
                             in_stack_ffffffffffffee80,in_stack_ffffffffffffee88,
                             in_stack_ffffffffffffee90,in_stack_ffffffffffffee98,
                             in_stack_ffffffffffffeea0,
                             (Array4<const_amrex::EBCellFlag> *)
                             in_stack_ffffffffffffeea8._M_head_impl,(bool)in_stack_ffffffffffffece3)
            ;
          }
          amrex::Array4<const_double>::Array4<const_double,_0>(local_1240,&local_a78);
          pAVar7 = &local_1280;
          amrex::Array4<const_double>::Array4<const_double,_0>(pAVar7,&local_ab8);
          in_stack_ffffffffffffdd30 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffed40;
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)in_stack_ffffffffffffdd30,
                     (Array4<double> *)(local_b48 + 0x50));
          in_stack_ffffffffffffdd68 =
               (MultiCutFab *)(CONCAT44(uVar10,(uint)local_682) & 0xffffffff00000001);
          in_stack_ffffffffffffdd58 = (BoxArray *)CONCAT44(uVar9,local_658);
          in_stack_ffffffffffffdd48 = (FabArrayBase *)local_10e8;
          in_stack_ffffffffffffdd40 = (FabArray<amrex::FArrayBox> *)(local_10e8 + 0x58);
          in_stack_ffffffffffffdd38 = &local_1038;
          uVar10 = (undefined4)((ulong)local_e10 >> 0x20);
          in_stack_ffffffffffffdd50 = in_stack_00000088;
          in_stack_ffffffffffffdd60 = (anon_class_128_2_3c46345a *)local_b48._64_8_;
          HydroUtils::EB_ComputeFluxes
                    (in_stack_ffffffffffffe238,in_stack_ffffffffffffe230,in_stack_ffffffffffffe228,
                     in_stack_ffffffffffffe220,in_stack_ffffffffffffe218,in_stack_ffffffffffffe210,
                     in_stack_ffffffffffffe440,in_stack_ffffffffffffe448,in_stack_ffffffffffffe450,
                     in_stack_ffffffffffffe458,in_stack_ffffffffffffe460,in_stack_ffffffffffffe468,
                     (Array4<const_double> *)
                     CONCAT44(in_stack_ffffffffffffe474,in_stack_ffffffffffffe470),
                     (Geometry *)CONCAT44(in_stack_ffffffffffffe47c,in_stack_ffffffffffffe478),
                     in_stack_ffffffffffffe480.itype,in_stack_ffffffffffffe488,
                     (bool)in_stack_ffffffffffffe20f);
          uVar9 = (undefined4)((ulong)pAVar7 >> 0x20);
          geom_00 = local_8e0;
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)&stack0xffffffffffffecf8,&local_9b8);
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)(local_1448 + 0x100),&local_9f8);
          amrex::Array4<const_double>::Array4<const_double,_0>
                    ((Array4<const_double> *)(local_1448 + 0xc0),&local_a38);
          in_stack_ffffffffffffdd28 =
               (FabArray<amrex::FArrayBox> *)(CONCAT44(uVar9,(uint)local_682) & 0xffffffff00000001);
          f2 = CONCAT44(uVar10,local_658);
          in_stack_ffffffffffffdd20 = in_stack_00000088;
          HydroUtils::EB_ComputeDivergence
                    ((Box *)in_stack_ffffffffffffdef0,(Array4<double> *)in_stack_ffffffffffffdee8,
                     in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8,
                     (Array4<const_double> *)in_stack_ffffffffffffded0,
                     (Array4<const_double> *)
                     CONCAT17(in_stack_ffffffffffffdecf,in_stack_ffffffffffffdec8),
                     (int)in_stack_ffffffffffffdf30,geom_00,in_stack_ffffffffffffdec0,
                     SUB41((uint)in_stack_ffffffffffffdebc >> 0x18,0));
        }
      }
      amrex::MFIter::operator++(&local_8d8);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffdd20);
    amrex::Geometry::periodicity((Geometry *)in_stack_ffffffffffffdd50);
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffdd40,(Periodicity *)in_stack_ffffffffffffdd38,
               SUB81((ulong)in_stack_ffffffffffffdd30 >> 0x38,0));
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffdd20);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffdd20,(char *)f2);
    target_volfrac = local_650;
    if (bVar1) {
      amrex::FabArrayBase::boxArray(local_660);
      amrex::FabArrayBase::DistributionMap(local_660);
      amrex::FabArrayBase::nGrow(local_660,0);
      aiStack_17e0._8_8_ = 0;
      _Stack_17d0._M_t.
      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::CutFab>_*,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
      .super__Head_base<0UL,_amrex::FabFactory<amrex::CutFab>_*,_false>._M_head_impl =
           (tuple<amrex::FabFactory<amrex::CutFab>_*,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
            )(_Tuple_impl<0UL,_amrex::FabFactory<amrex::CutFab>_*,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
              )0x0;
      local_17e8.data = (Ref *)0x0;
      aiStack_17e0[0] = 0;
      aiStack_17e0[1] = 0;
      local_17c8.m_arena = (Arena *)0x0;
      amrex::MFInfo::MFInfo((MFInfo *)0xdee80d);
      f2 = local_690;
      amrex::MultiFab::define
                ((MultiFab *)in_stack_ffffffffffffdd70,(BoxArray *)in_stack_ffffffffffffdd68,
                 (DistributionMapping *)in_stack_ffffffffffffdd60,
                 (int)((ulong)in_stack_ffffffffffffdd58 >> 0x20),(int)in_stack_ffffffffffffdd58,
                 (MFInfo *)in_stack_ffffffffffffdd50,
                 (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdd80);
      amrex::MFInfo::~MFInfo((MFInfo *)0xdee85e);
      target_volfrac = (FabArrayBase *)&stack0xffffffffffffe850;
      amrex::FabArrayBase::nGrow(local_660,0);
      amrex::MultiFab::Copy
                ((MultiFab *)in_stack_ffffffffffffdd50,(MultiFab *)in_stack_ffffffffffffdd48,
                 (int)((ulong)in_stack_ffffffffffffdd40 >> 0x20),(int)in_stack_ffffffffffffdd40,
                 (int)((ulong)in_stack_ffffffffffffdd38 >> 0x20),(int)in_stack_ffffffffffffdd38);
    }
    pMVar6 = amrex::MFItInfo::EnableTiling
                       (&local_874,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size);
    amrex::MFItInfo::SetDynamic(pMVar6,true);
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffdd50,in_stack_ffffffffffffdd48,
               (MFItInfo *)in_stack_ffffffffffffdd40);
    while (bVar1 = amrex::MFIter::isValid((MFIter *)(local_186c + 0x24)), bVar1) {
      amrex::MFIter::tilebox(in_stack_ffffffffffffdd80);
      local_186c._28_8_ = (element_type *)local_186c;
      amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                ((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
      local_1878 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                             ((FabArray<amrex::EBCellFlagFab> *)in_stack_ffffffffffffdd20,
                              (MFIter *)f2);
      local_340 = (((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_348 = &(((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).domain;
      local_34c = (((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_2f4 = 0;
      local_320 = (local_348->smallend).vect[0];
      local_304 = 1;
      iStack_31c = (((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).domain.smallend
                   .vect[1];
      local_368.x = (local_348->smallend).vect[0];
      local_368.y = (local_348->smallend).vect[1];
      local_314 = 2;
      local_368.z = (((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).domain.
                    smallend.vect[2];
      local_250 = &(((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_254 = 0;
      local_280 = local_250->vect[0] + 1;
      local_260 = &(((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_264 = 1;
      iStack_27c = (((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).domain.bigend.
                   vect[1] + 1;
      local_270 = &(((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_274 = 2;
      local_388.z = (((EBCellFlagFab *)local_1878)->super_BaseFab<amrex::EBCellFlag>).domain.bigend.
                    vect[2] + 1;
      local_388.y = iStack_27c;
      local_388.x = local_280;
      local_4a8 = (EBCellFlagFab *)local_1878;
      local_374._0_8_ = local_388._0_8_;
      local_374.z = local_388.z;
      local_358._0_8_ = local_368._0_8_;
      local_358.z = local_368.z;
      local_338._0_8_ = local_368._0_8_;
      local_338.z = local_368.z;
      local_328 = local_348;
      local_318 = local_368.z;
      local_310 = local_348;
      local_300 = local_348;
      local_2f0 = local_348;
      local_298._0_8_ = local_388._0_8_;
      local_298.z = local_388.z;
      local_288 = local_348;
      local_278 = local_388.z;
      amrex::Array4<const_amrex::EBCellFlag>::Array4
                (&local_18c0,local_340,&local_358,&local_374,local_34c);
      local_1880 = &local_18c0;
      FVar4 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffde48,in_stack_ffffffffffffde40);
      if (FVar4 != covered) {
        local_490 = (element_type *)local_186c._28_8_;
        local_494 = 4;
        local_18dc = (((Vector<int,_std::allocator<int>_> *)local_186c._28_8_)->
                     super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
        local_18d4 = (((Vector<int,_std::allocator<int>_> *)local_186c._28_8_)->
                     super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
        local_18cc = (((Vector<int,_std::allocator<int>_> *)local_186c._28_8_)->
                     super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage;
        local_18c4.itype =
             *(uint *)&(((Vector<int,_std::allocator<int>_> *)(local_186c._28_8_ + 0x18))->
                       super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
        amrex::Box::grow((Box *)&local_18dc,4);
        FVar4 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffde48,in_stack_ffffffffffffde40);
        if (FVar4 == regular) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                     (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
          local_1e88 = local_1ec8;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
          memcpy(local_1f88,local_1e88,0x3c);
          memcpy(&stack0xffffffffffffe0b8,local_1f08,0x3c);
          amrex::
          ParallelFor<int,EBMOL::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__6,void>
                    ((Box *)in_stack_ffffffffffffdd70,
                     (int)((ulong)in_stack_ffffffffffffdd68 >> 0x20),in_stack_ffffffffffffdd60);
        }
        else {
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          in_stack_ffffffffffffde40 = (Box *)0x1;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          in_stack_ffffffffffffde48 = (EBCellFlagFab *)local_1af0;
          amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_ffffffffffffdd20,f2);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          amrex::MultiCutFab::const_array(in_stack_ffffffffffffdd20,(MFIter *)f2);
          amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffdd20);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffdd20,(char *)f2);
          if (bVar1) {
            amrex::Box::grow((Box *)&stack0xffffffffffffe468,3);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffdd20,(char *)f2);
            if (bVar1) {
              amrex::Box::grow((Box *)&stack0xffffffffffffe468,2);
            }
          }
          amrex::FArrayBox::FArrayBox
                    ((FArrayBox *)in_stack_ffffffffffffdd30,(Box *)in_stack_ffffffffffffdd28,
                     (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffdd20 >> 0x18,0),
                     SUB81((ulong)in_stack_ffffffffffffdd20 >> 0x10,0),(Arena *)f2);
          amrex::BaseFab<double>::elixir<double,_0>((BaseFab<double> *)in_stack_ffffffffffffdd48);
          local_3e4 = 0;
          local_1b8 = auStack_1bc8;
          local_1bc = (int)((ulong)in_stack_ffffffffffffe450 >> 0x20);
          local_164 = 0;
          local_174 = 1;
          local_184 = 2;
          local_1d0 = (int)in_stack_ffffffffffffe440;
          local_110 = &stack0xffffffffffffe444;
          local_114 = 0;
          local_140 = (int)((ulong)in_stack_ffffffffffffe440 >> 0x20) + 1;
          local_120 = &stack0xffffffffffffe444;
          local_124 = 1;
          iStack_13c = (int)in_stack_ffffffffffffe448 + 1;
          local_130 = &stack0xffffffffffffe444;
          local_134 = 2;
          local_1f8.z = (int)((ulong)in_stack_ffffffffffffe448 >> 0x20) + 1;
          local_1f8.y = iStack_13c;
          local_1f8.x = local_140;
          local_3e0 = local_1be0;
          local_1e8[0]._0_8_ = local_1f8._0_8_;
          local_1e8[0].z = local_1f8.z;
          local_1c8.z = local_1d0;
          local_1a0 = local_1d0;
          local_198 = local_1b8;
          local_188 = local_1d0;
          local_180 = local_1b8;
          local_170 = local_1b8;
          local_160 = local_1b8;
          local_158._0_8_ = local_1f8._0_8_;
          local_158.z = local_1f8.z;
          local_148 = local_1b8;
          local_138 = local_1f8.z;
          amrex::Array4<double>::Array4(&local_428,local_1bd0,&local_1c8,local_1e8,local_1bc);
          amrex::Array4<double>::Array4<double,_0>(&local_1c38,&local_428,local_3e4);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffdd20,(char *)f2);
          if (bVar1) {
            amrex::Box::Box<double>((Box *)in_stack_ffffffffffffdd20,(Array4<double> *)f2);
            memcpy(&stack0xffffffffffffe368,&local_1c38,0x3c);
            amrex::
            ParallelFor<EBMOL::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__4>
                      ((Box *)in_stack_ffffffffffffdd70,
                       (anon_class_64_1_f62ae5da *)in_stack_ffffffffffffdd68);
          }
          local_430 = local_1be0;
          local_434 = local_658;
          local_c8 = auStack_1bc8;
          local_cc = (int)((ulong)in_stack_ffffffffffffe450 >> 0x20);
          local_74 = 0;
          local_84 = 1;
          local_94 = 2;
          local_e0 = (int)in_stack_ffffffffffffe440;
          local_20 = &stack0xffffffffffffe444;
          local_24 = 0;
          local_50 = (int)((ulong)in_stack_ffffffffffffe440 >> 0x20) + 1;
          local_30 = &stack0xffffffffffffe444;
          local_34 = 1;
          iStack_4c = (int)in_stack_ffffffffffffe448 + 1;
          local_40 = &stack0xffffffffffffe444;
          local_44 = 2;
          local_108.z = (int)((ulong)in_stack_ffffffffffffe448 >> 0x20) + 1;
          local_108.y = iStack_4c;
          local_108.x = local_50;
          local_f8[0]._0_8_ = local_108._0_8_;
          local_f8[0].z = local_108.z;
          local_d8.z = local_e0;
          local_b0 = local_e0;
          local_a8 = local_c8;
          local_98 = local_e0;
          local_90 = local_c8;
          local_80 = local_c8;
          local_70 = local_c8;
          local_68._0_8_ = local_108._0_8_;
          local_68.z = local_108.z;
          local_58 = local_c8;
          local_48 = local_108.z;
          amrex::Array4<double>::Array4(&local_478,local_1bd0,&local_d8,local_f8,local_cc);
          amrex::Array4<double>::Array4<double,_0>
                    ((Array4<double> *)local_1cd8,&local_478,local_434);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffdd28,(MFIter *)in_stack_ffffffffffffdd20);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                     (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
          f2 = local_1880;
          std::__cxx11::string::string((string *)(local_1db8 + 0x40),in_stack_00000098);
          in_stack_ffffffffffffdd80 = (MFIter *)local_1db8;
          amrex::Array4<const_double>::Array4((Array4<const_double> *)in_stack_ffffffffffffdd80);
          in_stack_ffffffffffffdd70 = (anon_class_128_2_3c46345a *)(local_1db8 + 0x40);
          in_stack_ffffffffffffdd48 = (FabArrayBase *)(local_1af0 + 0x70);
          in_stack_ffffffffffffdd30 = (FabArray<amrex::FArrayBox> *)local_19d0;
          in_stack_ffffffffffffdd28 = (FabArray<amrex::FArrayBox> *)(local_19d0 + 0x58);
          in_stack_ffffffffffffdd20 = (MultiCutFab *)(local_19d0 + 0xb0);
          in_stack_ffffffffffffdd60 = in_stack_00000080;
          in_stack_ffffffffffffdd68 = in_stack_00000088;
          Redistribution::Apply
                    ((Box *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe87c,
                     (Array4<double> *)in_stack_ffffffffffffe870,
                     (Array4<double> *)in_stack_ffffffffffffe868,
                     (Array4<const_double> *)in_stack_ffffffffffffe860,in_stack_ffffffffffffe858,
                     in_stack_fffffffffffff2b0,in_stack_fffffffffffff2b8,in_stack_fffffffffffff2c0,
                     in_stack_fffffffffffff2c8,in_stack_fffffffffffff2d0,in_stack_fffffffffffff2d8,
                     in_stack_fffffffffffff2e0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2f0,
                     in_stack_fffffffffffff2f8,in_stack_fffffffffffff300,
                     (Real)in_stack_ffffffffffffe850,in_stack_fffffffffffff308,
                     in_stack_fffffffffffff310,(Real)target_volfrac,in_stack_fffffffffffff318);
          std::__cxx11::string::~string((string *)(local_1db8 + 0x40));
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (in_stack_ffffffffffffdd30,(MFIter *)in_stack_ffffffffffffdd28,
                     (int)((ulong)in_stack_ffffffffffffdd20 >> 0x20));
          memcpy(local_1e80,local_1e00,0x3c);
          memcpy(auStack_1e40,local_1cd8,0x3c);
          amrex::
          ParallelFor<int,EBMOL::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,bool,std::__cxx11::string)::__5,void>
                    ((Box *)in_stack_ffffffffffffdd70,
                     (int)((ulong)in_stack_ffffffffffffdd68 >> 0x20),
                     (anon_class_128_2_a05675b6 *)in_stack_ffffffffffffdd60);
          amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_ffffffffffffdd20);
          amrex::FArrayBox::~FArrayBox((FArrayBox *)0xdef905);
        }
      }
      amrex::MFIter::operator++((MFIter *)(local_186c + 0x24));
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffdd20);
    amrex::MultiFab::~MultiFab((MultiFab *)0xdefa33);
    amrex::MultiFab::~MultiFab((MultiFab *)0xdefa40);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
EBMOL::ComputeSyncAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                         MultiFab const& state, int state_comp,
                         AMREX_D_DECL( MultiFab const& umac,
                                       MultiFab const& vmac,
                                       MultiFab const& wmac),
                         AMREX_D_DECL( MultiFab const& ucorr,
                                       MultiFab const& vcorr,
                                       MultiFab const& wcorr),
                         AMREX_D_DECL( MultiFab& xedge,
                                       MultiFab& yedge,
                                       MultiFab& zedge),
                         int  edge_comp,
                         bool known_edgestate,
                         AMREX_D_DECL( MultiFab& xfluxes,
                                       MultiFab& yfluxes,
                                       MultiFab& zfluxes),
                         int fluxes_comp,
                         Vector<BCRec> const& bcs,
                         BCRec  const* d_bcrec_ptr,
                         Geometry const&  geom,
                         const Real dt,
                         const bool is_velocity,
                         std::string redistribution_type )
{
    BL_PROFILE("EBMOL::ComputeSyncAofs()");

    bool fluxes_are_area_weighted = true;

    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););


    // To compute edge states, need at least 2 ghost cells in state
    if ( !known_edgestate )
        AMREX_ALWAYS_ASSERT(state.nGrow() >= 2);

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());
    auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());

    // Need 2 grow cells in state to compute the slopes needed to compute the edge state.
    int halo = known_edgestate ? 0 : 2;

    // Create temporary holder for advection term. Needed to fill ghost cells.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfactory);
    advc.setVal(0.);

    Box  const& domain = geom.Domain();
    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();
    AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
                      const Box& ybx = mfi.nodaltilebox(1);,
                      const Box& zbx = mfi.nodaltilebox(2); );

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

    AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        // Initialize covered cells
        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) == FabType::covered)
        {
            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {
            AMREX_D_TERM( Array4<Real const> uc = ucorr.const_array(mfi);,
                          Array4<Real const> vc = vcorr.const_array(mfi);,
                          Array4<Real const> wc = wcorr.const_array(mfi););

        Array4<Real> advc_arr = advc.array(mfi);

            bool regular = flagfab.getType(amrex::grow(bx,halo)) == FabType::regular;

            if (!regular)
            {
                AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

                Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);

                auto vfrac = ebfactory.getVolFrac().const_array(mfi);

                AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                                  Array4<Real const> v = vmac.const_array(mfi);,
                                  Array4<Real const> w = wmac.const_array(mfi););

                    EBMOL::ComputeEdgeState( bx,
                                             AMREX_D_DECL(xed,yed,zed),
                                             q, ncomp,
                                             AMREX_D_DECL(u,v,w),
                                             domain, bcs, d_bcrec_ptr,
                                             AMREX_D_DECL(fcx,fcy,fcz),
                                             ccc, vfrac, flag,
                                             is_velocity );
                }

                // Compute fluxes
                HydroUtils::EB_ComputeFluxes(bx,
                                             AMREX_D_DECL(fx,fy,fz),
                                             AMREX_D_DECL(uc,vc,wc),
                                             AMREX_D_DECL(xed,yed,zed),
                                             AMREX_D_DECL(apx,apy,apz),
                                             geom, ncomp, flag, fluxes_are_area_weighted  );

                // Compute divergence
        // Compute -div because that's what redistribution needs
                Real mult = -1.0;
                HydroUtils::EB_ComputeDivergence(bx, advc_arr,
                                                 AMREX_D_DECL(fx,fy,fz), vfrac,
                                                 ncomp, geom, mult, fluxes_are_area_weighted  );
            }
            else
            {
                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                                  Array4<Real const> v = vmac.const_array(mfi);,
                                  Array4<Real const> w = wmac.const_array(mfi););

                    MOL::ComputeEdgeState( bx,
                                           AMREX_D_DECL( xed, yed, zed ),
                                           q, ncomp,
                                           AMREX_D_DECL( u, v, w ),
                                           domain, bcs, d_bcrec_ptr,
                                           is_velocity);

                }

                // Compute fluxes
                HydroUtils::ComputeFluxes(bx,
                                          AMREX_D_DECL(fx,fy,fz),
                                          AMREX_D_DECL(uc,vc,wc),
                                          AMREX_D_DECL(xed,yed,zed),
                                          geom, ncomp, fluxes_are_area_weighted  );

                // Compute divergence
                // We use minus sign, i.e. -div, for consistency with EB above
                Real mult = -1.0;
                HydroUtils::ComputeDivergence(bx, advc_arr,
                                              AMREX_D_DECL(fx,fy,fz),
                                              ncomp, geom,
                                              mult, fluxes_are_area_weighted );
            }
    }
    }

    advc.FillBoundary(geom.periodicity());

    MultiFab sstate_tmp;
    MultiFab* sstate;
    if (redistribution_type == "StateRedist")
    {
      // Create temporary holder for sync "state" passed in via aofs
      // Do this so we're not overwriting the "state" as we go through the redistribution
      // process.
      sstate_tmp.define(state.boxArray(),state.DistributionMap(),ncomp,state.nGrow(),
                        MFInfo(),ebfactory);
      sstate = &sstate_tmp;
      MultiFab::Copy(*sstate,aofs,aofs_comp,0,ncomp,state.nGrow());
    }
    else
    {
      // Doesn't matter what we put here, sstate only gets used for StateRedist
      sstate = &aofs;
    }

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) != FabType::covered)
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
        auto vfrac = ebfactory.getVolFrac().const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);
        FArrayBox tmpfab(gbx, ncomp*2);
        Elixir eli = tmpfab.elixir();
        Array4<Real> scratch = tmpfab.array(0);
        if (redistribution_type == "FluxRedist")
        {
          amrex::ParallelFor(Box(scratch),
              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
              { scratch(i,j,k) = 1.;});
        }
        Array4<Real> divtmp_redist_arr = tmpfab.array(ncomp);

        // Redistribute
        //
        // For StateRedistribution, we use the Sync as the "state".
        // This may lead to oversmoothing.
        //
        Redistribution::Apply( bx, ncomp,  divtmp_redist_arr, advc.array(mfi),
                   sstate->const_array(mfi, 0), scratch, flag,
                   AMREX_D_DECL(apx,apy,apz), vfrac,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bcrec_ptr,
                   geom, dt, redistribution_type );

        // Subtract contribution to sync aofs -- sign of divergence in aofs is opposite
        // of sign of div as computed by EB_ComputeDivergence, thus it must be subtracted.
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_redist_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { aofs_arr( i, j, k, n ) -=  divtmp_redist_arr( i, j, k, n ); });
      }
      else
      {
        // Subtract contribution to sync aofs -- sign of divergence in aofs is opposite
        // of sign of div as computed here, and thus it must be subtracted.
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);
        Array4<Real> advc_arr = advc.array(mfi);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { aofs_arr( i, j, k, n ) -= advc_arr( i, j, k, n ); });
      }
    }
    }
}